

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void emit_destructor_code(FILE *out,symbol *sp,lemon *lemp,int *lineno)

{
  char *local_30;
  char *cp;
  int *lineno_local;
  lemon *lemp_local;
  symbol *sp_local;
  FILE *out_local;
  
  if (sp->type == TERMINAL) {
    local_30 = lemp->tokendest;
    if (local_30 == (char *)0x0) {
      return;
    }
    fprintf((FILE *)out,"{\n");
    *lineno = *lineno + 1;
  }
  else if (sp->destructor == (char *)0x0) {
    if (lemp->vardest == (char *)0x0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/misc/lemon.c"
                    ,0xcaf,
                    "void emit_destructor_code(FILE *, struct symbol *, struct lemon *, int *)");
    }
    local_30 = lemp->vardest;
    if (local_30 == (char *)0x0) {
      return;
    }
    fprintf((FILE *)out,"{\n");
    *lineno = *lineno + 1;
  }
  else {
    local_30 = sp->destructor;
    fprintf((FILE *)out,"{\n");
    *lineno = *lineno + 1;
    if (lemp->nolinenosflag == 0) {
      *lineno = *lineno + 1;
      tplt_linedir(out,sp->destLineno,lemp->filename);
    }
  }
  for (; *local_30 != '\0'; local_30 = local_30 + 1) {
    if ((*local_30 == '$') && (local_30[1] == '$')) {
      fprintf((FILE *)out,"(yypminor->yy%d)",(ulong)(uint)sp->dtnum);
      local_30 = local_30 + 1;
    }
    else {
      if (*local_30 == '\n') {
        *lineno = *lineno + 1;
      }
      fputc((int)*local_30,(FILE *)out);
    }
  }
  fprintf((FILE *)out,"\n");
  *lineno = *lineno + 1;
  if (lemp->nolinenosflag == 0) {
    *lineno = *lineno + 1;
    tplt_linedir(out,*lineno,lemp->outname);
  }
  fprintf((FILE *)out,"}\n");
  *lineno = *lineno + 1;
  return;
}

Assistant:

void emit_destructor_code(
  FILE *out,
  struct symbol *sp,
  struct lemon *lemp,
  int *lineno
){
 char *cp = 0;

 if( sp->type==TERMINAL ){
   cp = lemp->tokendest;
   if( cp==0 ) return;
   fprintf(out,"{\n"); (*lineno)++;
 }else if( sp->destructor ){
   cp = sp->destructor;
   fprintf(out,"{\n"); (*lineno)++;
   if (!lemp->nolinenosflag) { (*lineno)++; tplt_linedir(out,sp->destLineno,lemp->filename); }
 }else if( lemp->vardest ){
   cp = lemp->vardest;
   if( cp==0 ) return;
   fprintf(out,"{\n"); (*lineno)++;
 }else{
   assert( 0 );  /* Cannot happen */
 }
 for(; *cp; cp++){
   if( *cp=='$' && cp[1]=='$' ){
     fprintf(out,"(yypminor->yy%d)",sp->dtnum);
     cp++;
     continue;
   }
   if( *cp=='\n' ) (*lineno)++;
   fputc(*cp,out);
 }
 fprintf(out,"\n"); (*lineno)++;
 if (!lemp->nolinenosflag) { 
   (*lineno)++; tplt_linedir(out,*lineno,lemp->outname); 
 }
 fprintf(out,"}\n"); (*lineno)++;
 return;
}